

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

GCstr * argv2str(jit_State *J,TValue *o)

{
  GCstr *pGVar1;
  
  if ((o->field_2).it == 0xfffffffb) {
    pGVar1 = (GCstr *)(ulong)(o->u32).lo;
  }
  else {
    if (0xfffeffff < (o->field_2).it) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    pGVar1 = lj_strfmt_number(J->L,o);
    (o->u32).lo = (uint32_t)pGVar1;
    (o->field_2).it = 0xfffffffb;
  }
  return pGVar1;
}

Assistant:

static GCstr *argv2str(jit_State *J, TValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    return strV(o);
  } else {
    GCstr *s;
    if (!tvisnumber(o))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    s = lj_strfmt_number(J->L, o);
    setstrV(J->L, o, s);
    return s;
  }
}